

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::json_abi_v3_11_3::detail::
lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
::lexer(lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
        *this,iterator_input_adapter<const_char_*> *adapter,bool ignore_comments_)

{
  char cVar1;
  int_type iVar2;
  byte in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = (in_RSI->_M_dataplus)._M_p;
  in_RDI[1] = in_RSI->_M_string_length;
  *(byte *)(in_RDI + 2) = in_DL & 1;
  iVar2 = CLI::std::char_traits<char>::eof();
  *(int_type *)((long)in_RDI + 0x14) = iVar2;
  *(undefined1 *)(in_RDI + 3) = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  memset(in_RDI + 7,0,0x18);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x6ffda3);
  std::__cxx11::string::string(in_RSI);
  in_RDI[0xe] = "";
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  cVar1 = get_decimal_point();
  *(int *)(in_RDI + 0x12) = (int)cVar1;
  return;
}

Assistant:

explicit lexer(InputAdapterType&& adapter, bool ignore_comments_ = false) noexcept
        : ia(std::move(adapter))
        , ignore_comments(ignore_comments_)
        , decimal_point_char(static_cast<char_int_type>(get_decimal_point()))
    {}